

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall amrex::MLCellLinOp::prepareForSolve(MLCellLinOp *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int r;
  int iVar10;
  int iVar11;
  int iVar12;
  EBFArrayBoxFactory *this_00;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int i_6;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined8 *puVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  int j;
  long lVar26;
  int *piVar27;
  long lVar28;
  long lVar29;
  long *plVar30;
  uint uVar31;
  byte bVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  Long LVar39;
  double dVar40;
  double dVar41;
  IntVect IVar42;
  long local_5b0;
  Array4<double> local_590;
  Array4<double> local_550;
  long local_510;
  long local_508;
  int ki;
  int ji;
  int kb;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  int local_4cc;
  int local_4c8;
  int jb;
  long local_4c0;
  long local_4b8;
  IntVect hi;
  undefined4 uStack_4a4;
  long local_4a0;
  int local_490;
  int local_48c;
  int local_488;
  Array4<const_int> local_458;
  IntVect low;
  int iStack_40c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b0;
  Array4<const_double> local_3a8;
  double local_368;
  undefined8 uStack_360;
  double local_350 [4];
  ulong local_330;
  ulong local_328;
  long local_320;
  long local_318;
  long local_310;
  FabArray<amrex::EBCellFlagFab> *local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  long local_2e8;
  uint local_2dc;
  FabType local_2d8;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long *local_2c0;
  long *local_2b8;
  ulong local_2b0;
  Box local_2a4;
  double local_288;
  undefined8 uStack_280;
  MLCellLinOp *local_278;
  long local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  ulong local_230;
  Array<const_MultiCutFab_*,_3> local_228;
  MFIter mfi;
  MultiFab foo;
  
  uVar35 = (ulong)(this->super_MLLinOp).maxorder;
  local_2dc = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  uVar16 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
  local_320 = uVar35 - 2;
  local_268 = 0;
  local_230 = (ulong)local_2dc;
  local_278 = this;
  local_260 = uVar16;
  local_258 = uVar35;
  if ((int)local_2dc < 1) {
    local_230 = local_268;
  }
  do {
    if ((long)(this->super_MLLinOp).m_num_amr_levels <= (long)local_268) {
      return;
    }
    local_270 = local_268 * 0x18;
    lVar23 = 0;
    while (lVar26 = local_270,
          lVar23 < (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_268]) {
      local_2d0 = *(long *)(*(long *)((long)&(((this->m_bcondloc).
                                               super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                               .
                                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                             ).
                                             super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + local_270)
                           + lVar23 * 8);
      local_248 = lVar23 * 0x900 +
                  *(long *)((long)&(((this->m_maskvals).
                                     super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                   ).
                                   super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_270);
      lVar13 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_270);
      lVar18 = lVar23 * 200;
      local_2f0 = *(double *)(lVar13 + 0x38 + lVar18);
      local_2f8 = *(double *)(lVar13 + 0x40 + lVar18);
      local_300 = *(double *)(lVar13 + 0x48 + lVar18);
      local_250 = *(long *)((long)&(((this->m_undrrelxr).
                                     super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                   ).
                                   super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_270);
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      low.vect[0] = 0;
      low.vect[1] = 0;
      stack0xfffffffffffffbf0 = (Arena *)0x0;
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::MultiFab(&foo,(BoxArray *)
                              (lVar23 * 0x68 +
                              *(long *)((long)&(((this->super_MLLinOp).m_grids.
                                                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                 .
                                                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                               ).
                                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                               ._M_impl.super__Vector_impl_data._M_start + local_270
                                       )),
                         (DistributionMapping *)
                         (lVar23 * 0x10 +
                         *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ).
                                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ._M_impl.super__Vector_impl_data._M_start + local_270)),
                         local_2dc,0,(MFInfo *)&low,(FabFactory<amrex::FArrayBox> *)&mfi);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_408);
      lVar26 = *(long *)(*(long *)((long)&(((this->super_MLLinOp).m_factory.
                                            super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                          ).
                                          super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar26) +
                        lVar23 * 8);
      local_2c8 = lVar23;
      if ((lVar26 == 0) ||
         (this_00 = (EBFArrayBoxFactory *)
                    __dynamic_cast(lVar26,&FabFactory<amrex::FArrayBox>::typeinfo,
                                   &EBFArrayBoxFactory::typeinfo,0),
         this_00 == (EBFArrayBoxFactory *)0x0)) {
        local_228._M_elems[0] = (MultiCutFab *)0x0;
        local_228._M_elems[1] = (MultiCutFab *)0x0;
        local_228._M_elems[2] = (MultiCutFab *)0x0;
        local_308 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      }
      else {
        local_308 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
        EBFArrayBoxFactory::getAreaFrac(&local_228,this_00);
      }
      low.vect[0]._0_3_ = 0x10100;
      low.vect[1] = Gpu::Device::max_gpu_streams;
      stack0xfffffffffffffbf0 = (Arena *)0x0;
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_408.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      MFIter::MFIter(&mfi,(FabArrayBase *)&foo,(MFItInfo *)&low);
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::validbox(&local_2a4,&mfi);
        lVar23 = (long)mfi.currentIndex;
        if (mfi.local_index_map == (Vector<int,_std::allocator<int>_> *)0x0) {
          local_2c0 = (long *)(*(long *)(local_2d0 + 0x200) + lVar23 * 0x18);
          local_2b8 = (long *)(lVar23 * 0x18 + *(long *)(local_2d0 + 0xf0));
          iVar10 = mfi.currentIndex;
          if (local_308 != (FabArray<amrex::EBCellFlagFab> *)0x0) goto LAB_004f3a8c;
LAB_004f3ab0:
          local_2d8 = regular;
        }
        else {
          lVar26 = (long)((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar23] * 0x18;
          local_2c0 = (long *)(*(long *)(local_2d0 + 0x200) + lVar26);
          local_2b8 = (long *)(lVar26 + *(long *)(local_2d0 + 0xf0));
          if (local_308 == (FabArray<amrex::EBCellFlagFab> *)0x0) goto LAB_004f3ab0;
          iVar10 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar23];
LAB_004f3a8c:
          local_2d8 = EBCellFlagFab::getType
                                ((local_308->m_fabs_v).
                                 super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar10],&local_2a4);
        }
        for (uVar35 = 0; uVar35 != 3; uVar35 = uVar35 + 1) {
          if (uVar35 != uVar16) {
            low.vect[2] = local_2a4.smallend.vect[2];
            low.vect[0] = local_2a4.smallend.vect[0];
            low.vect[1] = local_2a4.smallend.vect[1];
            hi.vect[2] = local_2a4.bigend.vect[2];
            hi.vect[0] = local_2a4.bigend.vect[0];
            hi.vect[1] = local_2a4.bigend.vect[1];
            iVar10 = low.vect[uVar35] + -1;
            low.vect[uVar35] = iVar10;
            hi.vect[uVar35] = iVar10;
            iVar5 = hi.vect[2];
            local_510 = (long)low.vect[0];
            iVar8 = low.vect[1];
            lVar34 = (long)low.vect[1];
            local_4c8 = low.vect[2];
            local_4e8 = (long)low.vect[2];
            local_2e8 = (long)hi.vect[0];
            iVar4 = hi.vect[1];
            lVar26 = (long)hi.vect[1];
            stack0xfffffffffffffbf0 = (Arena *)CONCAT44(iStack_40c,local_2a4.smallend.vect[2]);
            low.vect[0] = local_2a4.smallend.vect[0];
            low.vect[1] = local_2a4.smallend.vect[1];
            hi.vect[2] = local_2a4.bigend.vect[2];
            hi.vect[0] = local_2a4.bigend.vect[0];
            hi.vect[1] = local_2a4.bigend.vect[1];
            IVar42 = Box::type(&local_2a4);
            local_458.p = IVar42.vect._0_8_;
            local_458.jstride._0_4_ = IVar42.vect[2];
            iVar10 = (~*(uint *)((long)&local_458.p + uVar35 * 4) & 1) + hi.vect[uVar35];
            low.vect[uVar35] = iVar10;
            hi.vect[uVar35] = iVar10;
            lVar23 = local_248;
            iVar6 = hi.vect[2];
            iVar7 = low.vect[0];
            lVar13 = (long)low.vect[0];
            jb = low.vect[1];
            local_508 = (long)low.vect[1];
            kb = low.vect[2];
            local_4f0 = (long)low.vect[2];
            lVar25 = (long)hi.vect[0];
            local_4d8 = (long)hi.vect[1];
            iVar10 = local_2a4.bigend.vect[uVar35];
            iVar17 = local_2a4.smallend.vect[uVar35];
            lVar18 = uVar35 * 0x180;
            local_2b0 = uVar35;
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      ((Array4<const_int> *)&hi,(FabArray<amrex::Mask> *)(local_248 + lVar18),&mfi);
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_458,(FabArray<amrex::Mask> *)(lVar23 + lVar18 + 0x480),&mfi);
            lVar23 = local_2c8 * 0x970 + local_250;
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_550,(FabArray<amrex::FArrayBox> *)(lVar18 + lVar23 + 8),&mfi);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_590,(FabArray<amrex::FArrayBox> *)(lVar18 + lVar23 + 0x488),&mfi);
            iVar11 = iVar8 + 1;
            uVar31 = (iVar10 - iVar17) + 2;
            local_328 = (ulong)uVar31;
            if ((int)local_258 < (int)uVar31) {
              local_328 = local_258 & 0xffffffff;
            }
            ji = (int)local_508 + -1;
            local_2d4 = (int)local_510 + 1;
            iVar10 = (int)local_4e8 + 1;
            ki = (int)local_4f0 + -1;
            local_330 = 0;
            if (0 < (int)local_328) {
              local_330 = local_328;
            }
            lVar36 = (long)((int)local_328 + -2);
            lVar23 = local_510 * 4;
            local_4b8 = local_510 * 8;
            lVar18 = lVar13 * 4;
            local_4c0 = lVar13 * 8;
            local_238 = (long)local_2d4;
            local_310 = (long)local_2d4 * 8;
            local_240 = (long)(iVar7 + -1);
            local_318 = local_240 * 8;
            local_5b0 = 0;
            uVar22 = 0;
            lVar14 = local_2e8;
            local_4e0 = lVar34;
            while( true ) {
              uVar9 = local_328;
              uVar20 = local_330;
              dVar41 = 1.0;
              dVar40 = 1.0;
              uVar35 = local_2b0;
              uVar16 = local_260;
              if (uVar22 == local_230) break;
              lVar34 = uVar22 * 0x18 + *local_2b8;
              iVar17 = *(int *)(lVar34 + local_2b0 * 4);
              local_3b0 = uVar22;
              lVar19 = uVar22 * 0x30 + *local_2c0;
              iVar33 = *(int *)(lVar34 + 0xc + local_2b0 * 4);
              dVar1 = *(double *)(lVar19 + local_2b0 * 8);
              dVar2 = *(double *)(lVar19 + 0x18 + local_2b0 * 8);
              iVar12 = (int)local_2b0;
              if (local_2d8 == regular) {
                if (iVar12 == 1) {
                  if (iVar17 == 0x65) {
                    low.vect._0_8_ = -dVar1 * local_2f8;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar16 = 0; lVar34 = local_4e8, uVar16 != uVar20; uVar16 = uVar16 + 1) {
                      dVar1 = dVar40;
                      dVar3 = dVar41;
                      for (uVar35 = 0; uVar9 != uVar35; uVar35 = uVar35 + 1) {
                        if (uVar16 != uVar35) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar35 * 2));
                          dVar3 = dVar3 * (*(double *)(low.vect + uVar16 * 2) -
                                          *(double *)(low.vect + uVar35 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar16] = (double *)(dVar1 / dVar3);
                    }
                    for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                      for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (*(int *)((long)(iVar8 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) * 4
                                     + (lVar34 - local_488) * local_4a0 * 4 + (long)local_490 * -4 +
                                     hi.vect._0_8_ + lVar23 + lVar19 * 4) < 1) {
                          LVar39 = 0;
                        }
                        *(Long *)((long)local_550.p +
                                 lVar19 * 8 +
                                 local_550.nstride * local_5b0 +
                                 (iVar11 - local_550.begin.y) * local_550.jstride * 8 +
                                 (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                 (long)local_550.begin.x * -8 + local_4b8) = LVar39;
                      }
                    }
                  }
                  else {
                    lVar34 = local_4e8;
                    if (iVar17 == 0x66) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_550.p +
                                  local_550.nstride * local_5b0 +
                                  (iVar11 - local_550.begin.y) * local_550.jstride * 8 +
                                  (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                  (long)local_550.begin.x * -8 + local_4b8);
                        for (lVar19 = local_510; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (iVar17 == 0x67) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (*(int *)((long)(iVar8 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) *
                                       4 + (lVar34 - local_488) * local_4a0 * 4 +
                                       (long)local_490 * -4 + hi.vect._0_8_ + lVar23 + lVar19 * 4) <
                              1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_550.p +
                                    lVar19 * 8 +
                                    local_550.nstride * local_5b0 +
                                    (iVar11 - local_550.begin.y) * local_550.jstride * 8 +
                                    (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                    (long)local_550.begin.x * -8 + local_4b8) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                  uVar35 = local_328;
                  uVar16 = local_330;
                  if (iVar33 == 0x65) {
                    low.vect._0_8_ = -dVar2 * local_2f8;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar22 = 0; lVar34 = local_4f0, uVar22 != uVar16; uVar22 = uVar22 + 1) {
                      dVar1 = dVar40;
                      dVar2 = dVar41;
                      for (uVar20 = 0; uVar35 != uVar20; uVar20 = uVar20 + 1) {
                        if (uVar22 != uVar20) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar20 * 2));
                          dVar2 = dVar2 * (*(double *)(low.vect + uVar22 * 2) -
                                          *(double *)(low.vect + uVar20 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar22] = (double *)(dVar1 / dVar2);
                    }
                    for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                      for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (local_458.p
                            [lVar13 + (((lVar34 - local_458.begin.z) * local_458.kstride +
                                       (long)(jb - local_458.begin.y) *
                                       CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                       lVar19) - (long)local_458.begin.x)] < 1) {
                          LVar39 = 0;
                        }
                        *(Long *)((long)local_590.p +
                                 lVar19 * 8 +
                                 local_590.nstride * local_5b0 +
                                 (ji - local_590.begin.y) * local_590.jstride * 8 +
                                 (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                 (long)local_590.begin.x * -8 + local_4c0) = LVar39;
                      }
                    }
                  }
                  else {
                    lVar34 = local_4f0;
                    if (iVar33 == 0x66) {
                      for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_590.p +
                                  local_590.nstride * local_5b0 +
                                  (ji - local_590.begin.y) * local_590.jstride * 8 +
                                  (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                  (long)local_590.begin.x * -8 + local_4c0);
                        for (lVar19 = lVar13; lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (iVar33 == 0x67) {
                      for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (local_458.p
                              [lVar13 + (((lVar34 - local_458.begin.z) * local_458.kstride +
                                         (long)(jb - local_458.begin.y) *
                                         CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                         lVar19) - (long)local_458.begin.x)] < 1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_590.p +
                                    lVar19 * 8 +
                                    local_590.nstride * local_5b0 +
                                    (ji - local_590.begin.y) * local_590.jstride * 8 +
                                    (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                    (long)local_590.begin.x * -8 + local_4c0) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                }
                else if (iVar12 == 0) {
                  if (iVar17 == 0x65) {
                    low.vect._0_8_ = -dVar1 * local_2f0;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar16 = 0; lVar34 = local_4e8, uVar16 != uVar20; uVar16 = uVar16 + 1) {
                      dVar1 = dVar40;
                      dVar3 = dVar41;
                      for (uVar35 = 0; uVar9 != uVar35; uVar35 = uVar35 + 1) {
                        if (uVar16 != uVar35) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar35 * 2));
                          dVar3 = dVar3 * (*(double *)(low.vect + uVar16 * 2) -
                                          *(double *)(low.vect + uVar35 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar16] = (double *)(dVar1 / dVar3);
                    }
                    for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                      piVar27 = (int *)((local_4e0 - local_48c) *
                                        CONCAT44(uStack_4a4,hi.vect[2]) * 4 +
                                        (lVar34 - local_488) * local_4a0 * 4 + (long)local_490 * -4
                                       + hi.vect._0_8_ + lVar23);
                      plVar30 = (long *)((long)local_550.p +
                                        local_550.nstride * local_5b0 +
                                        (local_4e0 - local_550.begin.y) * local_550.jstride * 8 +
                                        (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                        (long)local_550.begin.x * -8 + local_310);
                      for (lVar19 = local_4e0; lVar19 <= lVar26; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (*piVar27 < 1) {
                          LVar39 = 0;
                        }
                        *plVar30 = LVar39;
                        piVar27 = piVar27 + CONCAT44(uStack_4a4,hi.vect[2]);
                        plVar30 = plVar30 + local_550.jstride;
                      }
                    }
                  }
                  else {
                    lVar34 = local_4e8;
                    if (iVar17 == 0x66) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_550.p +
                                  local_550.nstride * local_5b0 +
                                  (local_4e0 - local_550.begin.y) * local_550.jstride * 8 +
                                  (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                  (long)local_550.begin.x * -8 + local_310);
                        for (lVar19 = local_4e0; lVar19 <= lVar26; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + local_550.jstride;
                        }
                      }
                    }
                    else if (iVar17 == 0x67) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        piVar27 = (int *)((local_4e0 - local_48c) *
                                          CONCAT44(uStack_4a4,hi.vect[2]) * 4 +
                                          (lVar34 - local_488) * local_4a0 * 4 +
                                          (long)local_490 * -4 + hi.vect._0_8_ + lVar23);
                        plVar30 = (long *)((long)local_550.p +
                                          local_550.nstride * local_5b0 +
                                          (local_4e0 - local_550.begin.y) * local_550.jstride * 8 +
                                          (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                          (long)local_550.begin.x * -8 + local_310);
                        for (lVar19 = local_4e0; lVar19 <= lVar26; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (*piVar27 < 1) {
                            uVar31 = 0;
                          }
                          *plVar30 = (ulong)uVar31 << 0x20;
                          piVar27 = piVar27 + CONCAT44(uStack_4a4,hi.vect[2]);
                          plVar30 = plVar30 + local_550.jstride;
                        }
                      }
                    }
                  }
                  uVar35 = local_328;
                  uVar16 = local_330;
                  if (iVar33 == 0x65) {
                    low.vect._0_8_ = -dVar2 * local_2f0;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar22 = 0; lVar34 = local_4f0, uVar22 != uVar16; uVar22 = uVar22 + 1) {
                      dVar1 = dVar40;
                      dVar2 = dVar41;
                      for (uVar20 = 0; uVar35 != uVar20; uVar20 = uVar20 + 1) {
                        if (uVar22 != uVar20) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar20 * 2));
                          dVar2 = dVar2 * (*(double *)(low.vect + uVar22 * 2) -
                                          *(double *)(low.vect + uVar20 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar22] = (double *)(dVar1 / dVar2);
                    }
                    for (; local_4cc = iVar33, (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                      piVar27 = (int *)((long)local_458.p +
                                       (local_508 - local_458.begin.y) *
                                       CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) * 4
                                       + (lVar34 - local_458.begin.z) * local_458.kstride * 4 +
                                       (long)local_458.begin.x * -4 + lVar18);
                      plVar30 = (long *)((long)local_590.p +
                                        local_590.nstride * local_5b0 +
                                        (local_508 - local_590.begin.y) * local_590.jstride * 8 +
                                        (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                        (long)local_590.begin.x * -8 + local_318);
                      for (lVar19 = local_508; lVar19 <= local_4d8; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (*piVar27 < 1) {
                          LVar39 = 0;
                        }
                        *plVar30 = LVar39;
                        piVar27 = piVar27 + CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride)
                        ;
                        plVar30 = plVar30 + local_590.jstride;
                      }
                    }
                  }
                  else {
                    lVar34 = local_4f0;
                    if (iVar33 == 0x66) {
                      for (; local_4cc = iVar33, (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_590.p +
                                  local_590.nstride * local_5b0 +
                                  (local_508 - local_590.begin.y) * local_590.jstride * 8 +
                                  (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                  (long)local_590.begin.x * -8 + local_318);
                        for (lVar19 = local_508; lVar19 <= local_4d8; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + local_590.jstride;
                        }
                      }
                    }
                    else {
                      local_4cc = iVar33;
                      if (iVar33 == 0x67) {
                        for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                          piVar27 = (int *)((long)local_458.p +
                                           (local_508 - local_458.begin.y) *
                                           CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride)
                                           * 4 + (lVar34 - local_458.begin.z) * local_458.kstride *
                                                 4 + (long)local_458.begin.x * -4 + lVar18);
                          plVar30 = (long *)((long)local_590.p +
                                            local_590.nstride * local_5b0 +
                                            (local_508 - local_590.begin.y) * local_590.jstride * 8
                                            + (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                            (long)local_590.begin.x * -8 + local_318);
                          for (lVar19 = local_508; lVar19 <= local_4d8; lVar19 = lVar19 + 1) {
                            uVar31 = 0x3ff00000;
                            if (*piVar27 < 1) {
                              uVar31 = 0;
                            }
                            *plVar30 = (ulong)uVar31 << 0x20;
                            piVar27 = piVar27 + CONCAT44(local_458.jstride._4_4_,
                                                         (int)local_458.jstride);
                            plVar30 = plVar30 + local_590.jstride;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  if (iVar17 == 0x65) {
                    low.vect._0_8_ = -dVar1 * local_300;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar16 = 0; lVar34 = local_4e0, uVar16 != uVar20; uVar16 = uVar16 + 1) {
                      dVar1 = dVar40;
                      dVar3 = dVar41;
                      for (uVar35 = 0; uVar9 != uVar35; uVar35 = uVar35 + 1) {
                        if (uVar16 != uVar35) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar35 * 2));
                          dVar3 = dVar3 * (*(double *)(low.vect + uVar16 * 2) -
                                          *(double *)(low.vect + uVar35 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar16] = (double *)(dVar1 / dVar3);
                    }
                    for (; (int)lVar34 <= iVar4; lVar34 = lVar34 + 1) {
                      for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (*(int *)((local_4c8 - local_488) * local_4a0 * 4 +
                                     (lVar34 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) * 4 +
                                     (long)local_490 * -4 + hi.vect._0_8_ + lVar23 + lVar19 * 4) < 1
                           ) {
                          LVar39 = 0;
                        }
                        *(Long *)((long)local_550.p +
                                 lVar19 * 8 +
                                 local_550.nstride * local_5b0 +
                                 (iVar10 - local_550.begin.z) * local_550.kstride * 8 +
                                 (lVar34 - local_550.begin.y) * local_550.jstride * 8 +
                                 (long)local_550.begin.x * -8 + local_4b8) = LVar39;
                      }
                    }
                  }
                  else {
                    lVar34 = local_4e0;
                    if (iVar17 == 0x66) {
                      for (; (int)lVar34 <= iVar4; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_550.p +
                                  local_550.nstride * local_5b0 +
                                  (iVar10 - local_550.begin.z) * local_550.kstride * 8 +
                                  (lVar34 - local_550.begin.y) * local_550.jstride * 8 +
                                  (long)local_550.begin.x * -8 + local_4b8);
                        for (lVar19 = local_510; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (iVar17 == 0x67) {
                      for (; (int)lVar34 <= iVar4; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (*(int *)((local_4c8 - local_488) * local_4a0 * 4 +
                                       (lVar34 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) * 4 +
                                       (long)local_490 * -4 + hi.vect._0_8_ + lVar23 + lVar19 * 4) <
                              1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_550.p +
                                    lVar19 * 8 +
                                    local_550.nstride * local_5b0 +
                                    (iVar10 - local_550.begin.z) * local_550.kstride * 8 +
                                    (lVar34 - local_550.begin.y) * local_550.jstride * 8 +
                                    (long)local_550.begin.x * -8 + local_4b8) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                  uVar35 = local_328;
                  uVar16 = local_330;
                  if (iVar33 == 0x65) {
                    low.vect._0_8_ = -dVar2 * local_300;
                    stack0xfffffffffffffbf0 = (Arena *)0x3fe0000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff8000000000000;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x4004000000000000;
                    local_3a8.kstride = 0;
                    local_3a8.nstride = 0;
                    local_3a8.p = (double *)0x0;
                    local_3a8.jstride = 0;
                    for (uVar22 = 0; lVar34 = local_508, uVar22 != uVar16; uVar22 = uVar22 + 1) {
                      dVar1 = dVar40;
                      dVar2 = dVar41;
                      for (uVar20 = 0; uVar35 != uVar20; uVar20 = uVar20 + 1) {
                        if (uVar22 != uVar20) {
                          dVar1 = dVar1 * (-0.5 - *(double *)(low.vect + uVar20 * 2));
                          dVar2 = dVar2 * (*(double *)(low.vect + uVar22 * 2) -
                                          *(double *)(low.vect + uVar20 * 2));
                        }
                      }
                      (&local_3a8.p)[uVar22] = (double *)(dVar1 / dVar2);
                    }
                    for (; (int)lVar34 <= (int)local_4d8; lVar34 = lVar34 + 1) {
                      for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                        LVar39 = local_3a8.jstride;
                        if (local_458.p
                            [lVar13 + (((lVar34 - local_458.begin.y) *
                                        CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                       (kb - local_458.begin.z) * local_458.kstride + lVar19) -
                                      (long)local_458.begin.x)] < 1) {
                          LVar39 = 0;
                        }
                        *(Long *)((long)local_590.p +
                                 lVar19 * 8 +
                                 local_590.nstride * local_5b0 +
                                 (ki - local_590.begin.z) * local_590.kstride * 8 +
                                 (lVar34 - local_590.begin.y) * local_590.jstride * 8 +
                                 (long)local_590.begin.x * -8 + local_4c0) = LVar39;
                      }
                    }
                  }
                  else {
                    lVar34 = local_508;
                    if (iVar33 == 0x66) {
                      for (; (int)lVar34 <= (int)local_4d8; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_590.p +
                                  local_590.nstride * local_5b0 +
                                  (ki - local_590.begin.z) * local_590.kstride * 8 +
                                  (lVar34 - local_590.begin.y) * local_590.jstride * 8 +
                                  (long)local_590.begin.x * -8 + local_4c0);
                        for (lVar19 = lVar13; lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (iVar33 == 0x67) {
                      for (; (int)lVar34 <= (int)local_4d8; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (local_458.p
                              [lVar13 + (((lVar34 - local_458.begin.y) *
                                          CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                         (kb - local_458.begin.z) * local_458.kstride + lVar19) -
                                        (long)local_458.begin.x)] < 1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_590.p +
                                    lVar19 * 8 +
                                    local_590.nstride * local_5b0 +
                                    (ki - local_590.begin.z) * local_590.kstride * 8 +
                                    (lVar34 - local_590.begin.y) * local_590.jstride * 8 +
                                    (long)local_590.begin.x * -8 + local_4c0) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                }
              }
              else if (local_2d8 == singlevalued) {
                local_368 = dVar1;
                uStack_360 = 0;
                local_288 = dVar2;
                uStack_280 = 0;
                local_4cc = iVar33;
                MultiCutFab::const_array(&local_3a8,local_228._M_elems[local_2b0],&mfi);
                lVar34 = local_320;
                if (iVar12 == 1) {
                  if (iVar17 == 0x65) {
                    local_350[0] = -local_368 * local_2f8;
                    local_350[1] = 0.5;
                    local_350[2] = 1.5;
                    local_350[3] = 2.5;
                    local_3c8 = 0;
                    uStack_3c0 = 0;
                    local_3d8 = 0;
                    uStack_3d0 = 0;
                    local_3e8 = 0;
                    uStack_3e0 = 0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    uStack_3f0 = 0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    low.vect[0] = 0;
                    low.vect[1] = 0;
                    stack0xfffffffffffffbf0 = (Arena *)0x0;
                    lVar19 = 2;
                    for (lVar15 = 0; iVar17 = local_4c8, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                      for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                        dVar40 = 1.0;
                        dVar41 = 1.0;
                        for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                          if (lVar28 != lVar29) {
                            dVar40 = dVar40 * (-0.5 - local_350[lVar29]);
                            dVar41 = dVar41 * (local_350[lVar28] - local_350[lVar29]);
                          }
                        }
                        *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar40 / dVar41;
                      }
                      lVar19 = lVar19 + 1;
                    }
                    for (; iVar17 <= iVar5; iVar17 = iVar17 + 1) {
                      local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                      lVar19 = (long)iVar17;
                      for (lVar34 = local_510; lVar34 <= lVar14; lVar34 = lVar34 + 1) {
                        uVar37 = 0;
                        uVar38 = 0;
                        if (0 < *(int *)((local_4e0 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) *
                                         4 + hi.vect._0_8_ + (lVar19 - local_488) * local_4a0 * 4 +
                                        (lVar34 - local_490) * 4)) {
                          lVar15 = 0;
                          bVar32 = 0;
                          while ((iVar33 = (int)lVar15, lVar15 <= lVar36 &&
                                 (0.0 < local_3a8.p
                                        [(lVar34 - local_3a8.begin.x) +
                                         (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                         ((iVar11 - local_3a8.begin.y) + iVar33) * local_3a8.jstride
                                        ]))) {
                            bVar32 = bVar32 | local_3a8.p
                                              [(lVar34 - local_3a8.begin.x) +
                                               (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                               ((iVar11 - local_3a8.begin.y) + iVar33) *
                                               local_3a8.jstride] < 1.0;
                            lVar15 = lVar15 + 1;
                          }
                          uVar31 = 2;
                          if (((bool)(bVar32 & 1 < iVar33 + 1U)) ||
                             (uVar31 = iVar33 + 1U, iVar33 != 0)) {
                            uVar37 = (undefined4)
                                     *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                            uVar38 = (undefined4)
                                     ((ulong)*(undefined8 *)
                                              (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >> 0x20)
                            ;
                          }
                        }
                        local_550.p
                        [((long)iVar11 - (long)local_550.begin.y) * local_550.jstride +
                         (lVar19 - local_550.begin.z) * local_550.kstride +
                         local_550.nstride * local_3b0 + (lVar34 - local_550.begin.x)] =
                             (double)CONCAT44(uVar38,uVar37);
                      }
                    }
                  }
                  else {
                    lVar34 = local_4e8;
                    if (iVar17 == 0x66) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_550.p +
                                  local_550.nstride * local_5b0 +
                                  (iVar11 - local_550.begin.y) * local_550.jstride * 8 +
                                  (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                  (long)local_550.begin.x * -8 + local_4b8);
                        for (lVar19 = local_510; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (iVar17 == 0x67) {
                      for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (*(int *)((long)(iVar8 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) *
                                       4 + (lVar34 - local_488) * local_4a0 * 4 +
                                       (long)local_490 * -4 + hi.vect._0_8_ + lVar23 + lVar19 * 4) <
                              1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_550.p +
                                    lVar19 * 8 +
                                    local_550.nstride * local_5b0 +
                                    (iVar11 - local_550.begin.y) * local_550.jstride * 8 +
                                    (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                    (long)local_550.begin.x * -8 + local_4b8) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                  lVar34 = local_320;
                  if (local_4cc == 0x65) {
                    local_350[0] = -local_288 * local_2f8;
                    local_350[1] = 0.5;
                    local_350[2] = 1.5;
                    local_350[3] = 2.5;
                    local_3c8 = 0;
                    uStack_3c0 = 0;
                    local_3d8 = 0;
                    uStack_3d0 = 0;
                    local_3e8 = 0;
                    uStack_3e0 = 0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    uStack_3f0 = 0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_408.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    low.vect[0] = 0;
                    low.vect[1] = 0;
                    stack0xfffffffffffffbf0 = (Arena *)0x0;
                    lVar19 = 2;
                    for (lVar15 = 0; iVar17 = kb, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                      for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                        dVar40 = 1.0;
                        dVar41 = 1.0;
                        for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                          if (lVar28 != lVar29) {
                            dVar40 = dVar40 * (-0.5 - local_350[lVar29]);
                            dVar41 = dVar41 * (local_350[lVar28] - local_350[lVar29]);
                          }
                        }
                        *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar40 / dVar41;
                      }
                      lVar19 = lVar19 + 1;
                    }
                    for (; iVar17 <= iVar6; iVar17 = iVar17 + 1) {
                      local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                      lVar19 = (long)iVar17;
                      for (lVar34 = lVar13; lVar34 <= lVar25; lVar34 = lVar34 + 1) {
                        uVar37 = 0;
                        uVar38 = 0;
                        if (0 < local_458.p
                                [(local_508 - local_458.begin.y) *
                                 CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                 (lVar19 - local_458.begin.z) * local_458.kstride +
                                 (lVar34 - local_458.begin.x)]) {
                          iVar33 = jb - local_3a8.begin.y;
                          lVar15 = 0;
                          bVar32 = 0;
                          while ((lVar15 <= lVar36 &&
                                 (0.0 < local_3a8.p
                                        [(lVar34 - local_3a8.begin.x) +
                                         (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                         iVar33 * local_3a8.jstride]))) {
                            bVar32 = bVar32 | local_3a8.p
                                              [(lVar34 - local_3a8.begin.x) +
                                               (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                               iVar33 * local_3a8.jstride] < 1.0;
                            lVar15 = lVar15 + 1;
                            iVar33 = iVar33 + -1;
                          }
                          uVar24 = (int)lVar15 + 1;
                          uVar31 = 2;
                          if (((bool)(bVar32 & 1 < uVar24)) || (uVar31 = uVar24, (int)lVar15 != 0))
                          {
                            uVar37 = (undefined4)
                                     *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                            uVar38 = (undefined4)
                                     ((ulong)*(undefined8 *)
                                              (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >> 0x20)
                            ;
                          }
                        }
                        local_590.p
                        [((long)ji - (long)local_590.begin.y) * local_590.jstride +
                         (lVar19 - local_590.begin.z) * local_590.kstride +
                         local_590.nstride * local_3b0 + (lVar34 - local_590.begin.x)] =
                             (double)CONCAT44(uVar38,uVar37);
                      }
                    }
                  }
                  else {
                    lVar34 = local_4f0;
                    if (local_4cc == 0x66) {
                      for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                        puVar21 = (undefined8 *)
                                  ((long)local_590.p +
                                  local_590.nstride * local_5b0 +
                                  (ji - local_590.begin.y) * local_590.jstride * 8 +
                                  (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                  (long)local_590.begin.x * -8 + local_4c0);
                        for (lVar19 = lVar13; lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          *puVar21 = 0x3ff0000000000000;
                          puVar21 = puVar21 + 1;
                        }
                      }
                    }
                    else if (local_4cc == 0x67) {
                      for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                        for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                          uVar31 = 0x3ff00000;
                          if (local_458.p
                              [lVar13 + (((lVar34 - local_458.begin.z) * local_458.kstride +
                                         (long)(jb - local_458.begin.y) *
                                         CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                         lVar19) - (long)local_458.begin.x)] < 1) {
                            uVar31 = 0;
                          }
                          *(ulong *)((long)local_590.p +
                                    lVar19 * 8 +
                                    local_590.nstride * local_5b0 +
                                    (ji - local_590.begin.y) * local_590.jstride * 8 +
                                    (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                    (long)local_590.begin.x * -8 + local_4c0) =
                               (ulong)uVar31 << 0x20;
                        }
                      }
                    }
                  }
                }
                else {
                  dVar40 = 1.0;
                  dVar41 = 1.0;
                  if (iVar12 == 0) {
                    if (iVar17 == 0x65) {
                      local_350[0] = -local_368 * local_2f0;
                      local_350[1] = 0.5;
                      local_350[2] = 1.5;
                      local_350[3] = 2.5;
                      local_3c8 = 0;
                      uStack_3c0 = 0;
                      local_3d8 = 0;
                      uStack_3d0 = 0;
                      local_3e8 = 0;
                      uStack_3e0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      uStack_3f0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      low.vect[0] = 0;
                      low.vect[1] = 0;
                      stack0xfffffffffffffbf0 = (Arena *)0x0;
                      lVar19 = 2;
                      for (lVar15 = 0; iVar17 = local_4c8, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                        for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                          dVar1 = dVar40;
                          dVar2 = dVar41;
                          for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                            if (lVar28 != lVar29) {
                              dVar1 = dVar1 * (-0.5 - local_350[lVar29]);
                              dVar2 = dVar2 * (local_350[lVar28] - local_350[lVar29]);
                            }
                          }
                          *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar1 / dVar2;
                        }
                        lVar19 = lVar19 + 1;
                      }
                      for (; iVar17 <= iVar5; iVar17 = iVar17 + 1) {
                        local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                        lVar19 = (long)iVar17;
                        for (lVar34 = local_4e0; lVar34 <= lVar26; lVar34 = lVar34 + 1) {
                          uVar37 = 0;
                          uVar38 = 0;
                          if (0 < *(int *)((local_510 - local_490) * 4 + hi.vect._0_8_ +
                                           (lVar19 - local_488) * local_4a0 * 4 +
                                          (lVar34 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) * 4
                                          )) {
                            lVar14 = 0;
                            bVar32 = 0;
                            while ((iVar33 = (int)lVar14, lVar14 <= lVar36 &&
                                   (0.0 < local_3a8.p
                                          [(lVar34 - local_3a8.begin.y) * local_3a8.jstride +
                                           (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                           (long)((local_2d4 - local_3a8.begin.x) + iVar33)]))) {
                              bVar32 = bVar32 | local_3a8.p
                                                [(lVar34 - local_3a8.begin.y) * local_3a8.jstride +
                                                 (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                                 (long)((local_2d4 - local_3a8.begin.x) + iVar33)] <
                                                1.0;
                              lVar14 = lVar14 + 1;
                            }
                            uVar31 = 2;
                            lVar14 = local_2e8;
                            if (((bool)(bVar32 & 1 < iVar33 + 1U)) ||
                               (uVar31 = iVar33 + 1U, iVar33 != 0)) {
                              uVar37 = (undefined4)
                                       *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                              uVar38 = (undefined4)
                                       ((ulong)*(undefined8 *)
                                                (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >>
                                       0x20);
                            }
                          }
                          local_550.p
                          [(local_238 - local_550.begin.x) +
                           (lVar19 - local_550.begin.z) * local_550.kstride +
                           local_550.nstride * local_3b0 +
                           (lVar34 - local_550.begin.y) * local_550.jstride] =
                               (double)CONCAT44(uVar38,uVar37);
                        }
                      }
                    }
                    else {
                      lVar34 = local_4e8;
                      if (iVar17 == 0x66) {
                        for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                          puVar21 = (undefined8 *)
                                    ((long)local_550.p +
                                    local_550.nstride * local_5b0 +
                                    (local_4e0 - local_550.begin.y) * local_550.jstride * 8 +
                                    (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                    (long)local_550.begin.x * -8 + local_310);
                          for (lVar19 = local_4e0; lVar19 <= lVar26; lVar19 = lVar19 + 1) {
                            *puVar21 = 0x3ff0000000000000;
                            puVar21 = puVar21 + local_550.jstride;
                          }
                        }
                      }
                      else if (iVar17 == 0x67) {
                        for (; (int)lVar34 <= iVar5; lVar34 = lVar34 + 1) {
                          piVar27 = (int *)((local_4e0 - local_48c) *
                                            CONCAT44(uStack_4a4,hi.vect[2]) * 4 +
                                            (lVar34 - local_488) * local_4a0 * 4 +
                                            (long)local_490 * -4 + hi.vect._0_8_ + lVar23);
                          plVar30 = (long *)((long)local_550.p +
                                            local_550.nstride * local_5b0 +
                                            (local_4e0 - local_550.begin.y) * local_550.jstride * 8
                                            + (lVar34 - local_550.begin.z) * local_550.kstride * 8 +
                                            (long)local_550.begin.x * -8 + local_310);
                          for (lVar19 = local_4e0; lVar19 <= lVar26; lVar19 = lVar19 + 1) {
                            uVar31 = 0x3ff00000;
                            if (*piVar27 < 1) {
                              uVar31 = 0;
                            }
                            *plVar30 = (ulong)uVar31 << 0x20;
                            piVar27 = piVar27 + CONCAT44(uStack_4a4,hi.vect[2]);
                            plVar30 = plVar30 + local_550.jstride;
                          }
                        }
                      }
                    }
                    lVar34 = local_320;
                    if (local_4cc == 0x65) {
                      local_350[0] = -local_288 * local_2f0;
                      local_350[1] = 0.5;
                      local_350[2] = 1.5;
                      local_350[3] = 2.5;
                      local_3c8 = 0;
                      uStack_3c0 = 0;
                      local_3d8 = 0;
                      uStack_3d0 = 0;
                      local_3e8 = 0;
                      uStack_3e0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      uStack_3f0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      low.vect[0] = 0;
                      low.vect[1] = 0;
                      stack0xfffffffffffffbf0 = (Arena *)0x0;
                      lVar19 = 2;
                      for (lVar15 = 0; iVar17 = kb, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                        for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                          dVar1 = dVar40;
                          dVar2 = dVar41;
                          for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                            if (lVar28 != lVar29) {
                              dVar1 = dVar1 * (-0.5 - local_350[lVar29]);
                              dVar2 = dVar2 * (local_350[lVar28] - local_350[lVar29]);
                            }
                          }
                          *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar1 / dVar2;
                        }
                        lVar19 = lVar19 + 1;
                      }
                      for (; iVar17 <= iVar6; iVar17 = iVar17 + 1) {
                        local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                        lVar19 = (long)iVar17;
                        for (lVar34 = local_508; lVar34 <= local_4d8; lVar34 = lVar34 + 1) {
                          uVar37 = 0;
                          uVar38 = 0;
                          if (0 < local_458.p
                                  [(lVar13 - local_458.begin.x) +
                                   (lVar19 - local_458.begin.z) * local_458.kstride +
                                   (lVar34 - local_458.begin.y) *
                                   CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride)]) {
                            iVar33 = iVar7 - local_3a8.begin.x;
                            lVar15 = 0;
                            bVar32 = 0;
                            while ((lVar15 <= lVar36 &&
                                   (0.0 < local_3a8.p
                                          [(lVar34 - local_3a8.begin.y) * local_3a8.jstride +
                                           (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                           (long)iVar33]))) {
                              bVar32 = bVar32 | local_3a8.p
                                                [(lVar34 - local_3a8.begin.y) * local_3a8.jstride +
                                                 (lVar19 - local_3a8.begin.z) * local_3a8.kstride +
                                                 (long)iVar33] < 1.0;
                              lVar15 = lVar15 + 1;
                              iVar33 = iVar33 + -1;
                            }
                            uVar24 = (int)lVar15 + 1;
                            uVar31 = 2;
                            lVar14 = local_2e8;
                            if (((bool)(bVar32 & 1 < uVar24)) || (uVar31 = uVar24, (int)lVar15 != 0)
                               ) {
                              uVar37 = (undefined4)
                                       *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                              uVar38 = (undefined4)
                                       ((ulong)*(undefined8 *)
                                                (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >>
                                       0x20);
                            }
                          }
                          local_590.p
                          [(local_240 - local_590.begin.x) +
                           (lVar19 - local_590.begin.z) * local_590.kstride +
                           local_590.nstride * local_3b0 +
                           (lVar34 - local_590.begin.y) * local_590.jstride] =
                               (double)CONCAT44(uVar38,uVar37);
                        }
                      }
                    }
                    else {
                      lVar34 = local_4f0;
                      if (local_4cc == 0x66) {
                        for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                          puVar21 = (undefined8 *)
                                    ((long)local_590.p +
                                    local_590.nstride * local_5b0 +
                                    (local_508 - local_590.begin.y) * local_590.jstride * 8 +
                                    (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                    (long)local_590.begin.x * -8 + local_318);
                          for (lVar19 = local_508; lVar19 <= local_4d8; lVar19 = lVar19 + 1) {
                            *puVar21 = 0x3ff0000000000000;
                            puVar21 = puVar21 + local_590.jstride;
                          }
                        }
                      }
                      else if (local_4cc == 0x67) {
                        for (; (int)lVar34 <= iVar6; lVar34 = lVar34 + 1) {
                          piVar27 = (int *)((long)local_458.p +
                                           (local_508 - local_458.begin.y) *
                                           CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride)
                                           * 4 + (lVar34 - local_458.begin.z) * local_458.kstride *
                                                 4 + (long)local_458.begin.x * -4 + lVar18);
                          plVar30 = (long *)((long)local_590.p +
                                            local_590.nstride * local_5b0 +
                                            (local_508 - local_590.begin.y) * local_590.jstride * 8
                                            + (lVar34 - local_590.begin.z) * local_590.kstride * 8 +
                                            (long)local_590.begin.x * -8 + local_318);
                          for (lVar19 = local_508; lVar19 <= local_4d8; lVar19 = lVar19 + 1) {
                            uVar31 = 0x3ff00000;
                            if (*piVar27 < 1) {
                              uVar31 = 0;
                            }
                            *plVar30 = (ulong)uVar31 << 0x20;
                            piVar27 = piVar27 + CONCAT44(local_458.jstride._4_4_,
                                                         (int)local_458.jstride);
                            plVar30 = plVar30 + local_590.jstride;
                          }
                        }
                      }
                    }
                  }
                  else {
                    if (iVar17 == 0x65) {
                      local_350[0] = -local_368 * local_300;
                      local_350[1] = 0.5;
                      local_350[2] = 1.5;
                      local_350[3] = 2.5;
                      local_3c8 = 0;
                      uStack_3c0 = 0;
                      local_3d8 = 0;
                      uStack_3d0 = 0;
                      local_3e8 = 0;
                      uStack_3e0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      uStack_3f0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      low.vect[0] = 0;
                      low.vect[1] = 0;
                      stack0xfffffffffffffbf0 = (Arena *)0x0;
                      lVar19 = 2;
                      for (lVar15 = 0; iVar17 = iVar8, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                        for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                          dVar1 = dVar40;
                          dVar2 = dVar41;
                          for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                            if (lVar28 != lVar29) {
                              dVar1 = dVar1 * (-0.5 - local_350[lVar29]);
                              dVar2 = dVar2 * (local_350[lVar28] - local_350[lVar29]);
                            }
                          }
                          *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar1 / dVar2;
                        }
                        lVar19 = lVar19 + 1;
                      }
                      for (; iVar17 <= iVar4; iVar17 = iVar17 + 1) {
                        local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                        lVar19 = (long)iVar17;
                        for (lVar34 = local_510; lVar34 <= lVar14; lVar34 = lVar34 + 1) {
                          uVar37 = 0;
                          uVar38 = 0;
                          if (0 < *(int *)((lVar19 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) *
                                           4 + hi.vect._0_8_ +
                                           (local_4e8 - local_488) * local_4a0 * 4 +
                                          (lVar34 - local_490) * 4)) {
                            lVar15 = 0;
                            bVar32 = 0;
                            while ((iVar33 = (int)lVar15, lVar15 <= lVar36 &&
                                   (0.0 < local_3a8.p
                                          [(lVar19 - local_3a8.begin.y) * local_3a8.jstride +
                                           (lVar34 - local_3a8.begin.x) +
                                           ((iVar10 - local_3a8.begin.z) + iVar33) *
                                           local_3a8.kstride]))) {
                              bVar32 = bVar32 | local_3a8.p
                                                [(lVar19 - local_3a8.begin.y) * local_3a8.jstride +
                                                 (lVar34 - local_3a8.begin.x) +
                                                 ((iVar10 - local_3a8.begin.z) + iVar33) *
                                                 local_3a8.kstride] < 1.0;
                              lVar15 = lVar15 + 1;
                            }
                            uVar31 = 2;
                            if (((bool)(bVar32 & 1 < iVar33 + 1U)) ||
                               (uVar31 = iVar33 + 1U, iVar33 != 0)) {
                              uVar37 = (undefined4)
                                       *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                              uVar38 = (undefined4)
                                       ((ulong)*(undefined8 *)
                                                (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >>
                                       0x20);
                            }
                          }
                          local_550.p
                          [(lVar19 - local_550.begin.y) * local_550.jstride +
                           ((long)iVar10 - (long)local_550.begin.z) * local_550.kstride +
                           local_550.nstride * local_3b0 + (lVar34 - local_550.begin.x)] =
                               (double)CONCAT44(uVar38,uVar37);
                        }
                      }
                    }
                    else {
                      lVar34 = local_4e0;
                      if (iVar17 == 0x66) {
                        for (; (int)lVar34 <= iVar4; lVar34 = lVar34 + 1) {
                          puVar21 = (undefined8 *)
                                    ((long)local_550.p +
                                    local_550.nstride * local_5b0 +
                                    (iVar10 - local_550.begin.z) * local_550.kstride * 8 +
                                    (lVar34 - local_550.begin.y) * local_550.jstride * 8 +
                                    (long)local_550.begin.x * -8 + local_4b8);
                          for (lVar19 = local_510; lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                            *puVar21 = 0x3ff0000000000000;
                            puVar21 = puVar21 + 1;
                          }
                        }
                      }
                      else if (iVar17 == 0x67) {
                        for (; (int)lVar34 <= iVar4; lVar34 = lVar34 + 1) {
                          for (lVar19 = 0; local_510 + lVar19 <= lVar14; lVar19 = lVar19 + 1) {
                            uVar31 = 0x3ff00000;
                            if (*(int *)((local_4c8 - local_488) * local_4a0 * 4 +
                                         (lVar34 - local_48c) * CONCAT44(uStack_4a4,hi.vect[2]) * 4
                                         + (long)local_490 * -4 + hi.vect._0_8_ + lVar23 +
                                        lVar19 * 4) < 1) {
                              uVar31 = 0;
                            }
                            *(ulong *)((long)local_550.p +
                                      lVar19 * 8 +
                                      local_550.nstride * local_5b0 +
                                      (iVar10 - local_550.begin.z) * local_550.kstride * 8 +
                                      (lVar34 - local_550.begin.y) * local_550.jstride * 8 +
                                      (long)local_550.begin.x * -8 + local_4b8) =
                                 (ulong)uVar31 << 0x20;
                          }
                        }
                      }
                    }
                    lVar34 = local_320;
                    if (local_4cc == 0x65) {
                      local_350[0] = -local_288 * local_300;
                      local_350[1] = 0.5;
                      local_350[2] = 1.5;
                      local_350[3] = 2.5;
                      local_3c8 = 0;
                      uStack_3c0 = 0;
                      local_3d8 = 0;
                      uStack_3d0 = 0;
                      local_3e8 = 0;
                      uStack_3e0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      uStack_3f0 = 0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_408.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      low.vect[0] = 0;
                      low.vect[1] = 0;
                      stack0xfffffffffffffbf0 = (Arena *)0x0;
                      lVar19 = 2;
                      for (lVar15 = 0; iVar17 = jb, lVar15 <= lVar34; lVar15 = lVar15 + 1) {
                        for (lVar28 = 0; lVar28 != lVar19; lVar28 = lVar28 + 1) {
                          dVar1 = dVar40;
                          dVar2 = dVar41;
                          for (lVar29 = 0; lVar19 != lVar29; lVar29 = lVar29 + 1) {
                            if (lVar28 != lVar29) {
                              dVar1 = dVar1 * (-0.5 - local_350[lVar29]);
                              dVar2 = dVar2 * (local_350[lVar28] - local_350[lVar29]);
                            }
                          }
                          *(double *)((long)&low + lVar28 * 8 + lVar15 * 0x20) = dVar1 / dVar2;
                        }
                        lVar19 = lVar19 + 1;
                      }
                      for (; iVar17 <= (int)local_4d8; iVar17 = iVar17 + 1) {
                        local_368 = (double)CONCAT44(local_368._4_4_,iVar17);
                        lVar19 = (long)iVar17;
                        for (lVar34 = lVar13; lVar34 <= lVar25; lVar34 = lVar34 + 1) {
                          uVar37 = 0;
                          uVar38 = 0;
                          if (0 < local_458.p
                                  [(lVar19 - local_458.begin.y) *
                                   CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) +
                                   (local_4f0 - local_458.begin.z) * local_458.kstride +
                                   (lVar34 - local_458.begin.x)]) {
                            iVar33 = kb - local_3a8.begin.z;
                            lVar15 = 0;
                            bVar32 = 0;
                            while ((lVar15 <= lVar36 &&
                                   (0.0 < local_3a8.p
                                          [(lVar19 - local_3a8.begin.y) * local_3a8.jstride +
                                           (lVar34 - local_3a8.begin.x) + iVar33 * local_3a8.kstride
                                          ]))) {
                              bVar32 = bVar32 | local_3a8.p
                                                [(lVar19 - local_3a8.begin.y) * local_3a8.jstride +
                                                 (lVar34 - local_3a8.begin.x) +
                                                 iVar33 * local_3a8.kstride] < 1.0;
                              lVar15 = lVar15 + 1;
                              iVar33 = iVar33 + -1;
                            }
                            uVar24 = (int)lVar15 + 1;
                            uVar31 = 2;
                            if (((bool)(bVar32 & 1 < uVar24)) || (uVar31 = uVar24, (int)lVar15 != 0)
                               ) {
                              uVar37 = (undefined4)
                                       *(undefined8 *)(low.vect + (long)(int)(uVar31 * 4 + -7) * 2);
                              uVar38 = (undefined4)
                                       ((ulong)*(undefined8 *)
                                                (low.vect + (long)(int)(uVar31 * 4 + -7) * 2) >>
                                       0x20);
                            }
                          }
                          local_590.p
                          [(lVar19 - local_590.begin.y) * local_590.jstride +
                           ((long)ki - (long)local_590.begin.z) * local_590.kstride +
                           local_590.nstride * local_3b0 + (lVar34 - local_590.begin.x)] =
                               (double)CONCAT44(uVar38,uVar37);
                        }
                      }
                    }
                    else {
                      lVar34 = local_508;
                      if (local_4cc == 0x66) {
                        for (; (int)lVar34 <= (int)local_4d8; lVar34 = lVar34 + 1) {
                          puVar21 = (undefined8 *)
                                    ((long)local_590.p +
                                    local_590.nstride * local_5b0 +
                                    (ki - local_590.begin.z) * local_590.kstride * 8 +
                                    (lVar34 - local_590.begin.y) * local_590.jstride * 8 +
                                    (long)local_590.begin.x * -8 + local_4c0);
                          for (lVar19 = lVar13; lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                            *puVar21 = 0x3ff0000000000000;
                            puVar21 = puVar21 + 1;
                          }
                        }
                      }
                      else if (local_4cc == 0x67) {
                        for (; (int)lVar34 <= (int)local_4d8; lVar34 = lVar34 + 1) {
                          for (lVar19 = 0; lVar13 + lVar19 <= lVar25; lVar19 = lVar19 + 1) {
                            uVar31 = 0x3ff00000;
                            if (local_458.p
                                [lVar13 + (((lVar34 - local_458.begin.y) *
                                            CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride)
                                           + (kb - local_458.begin.z) * local_458.kstride + lVar19)
                                          - (long)local_458.begin.x)] < 1) {
                              uVar31 = 0;
                            }
                            *(ulong *)((long)local_590.p +
                                      lVar19 * 8 +
                                      local_590.nstride * local_5b0 +
                                      (ki - local_590.begin.z) * local_590.kstride * 8 +
                                      (lVar34 - local_590.begin.y) * local_590.jstride * 8 +
                                      (long)local_590.begin.x * -8 + local_4c0) =
                                 (ulong)uVar31 << 0x20;
                          }
                        }
                      }
                    }
                  }
                }
              }
              uVar22 = local_3b0 + 1;
              local_5b0 = local_5b0 + 8;
            }
          }
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
      MultiFab::~MultiFab(&foo);
      this = local_278;
      lVar23 = local_2c8 + 1;
    }
    local_268 = local_268 + 1;
  } while( true );
}

Assistant:

void
MLCellLinOp::prepareForSolve ()
{
    BL_PROFILE("MLCellLinOp::prepareForSolve()");

    const int imaxorder = maxorder;
    const int ncomp = getNComp();
    const int hidden_direction = hiddenDirection();
    for (int amrlev = 0;  amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const auto& bcondloc = *m_bcondloc[amrlev][mglev];
            const auto& maskvals = m_maskvals[amrlev][mglev];

            const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
            const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
            const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

            BndryRegister& undrrelxr = m_undrrelxr[amrlev][mglev];
            MultiFab foo(m_grids[amrlev][mglev], m_dmap[amrlev][mglev], ncomp, 0, MFInfo().SetAlloc(false));

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
            const FabArray<EBCellFlagFab>* flags =
                (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            auto area = (factory) ? factory->getAreaFrac()
                : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
#endif

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
#ifdef AMREX_USE_EB
                if (factory) {
                    Vector<PSEBTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction && fabtyp != FabType::covered) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                auto const& ap = (fabtyp == FabType::singlevalued)
                                    ? area[idim]->const_array(mfi) : Array4<Real const>{};
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSEBTag{undrrelxr[olo].array(mfi),
                                                              undrrelxr[ohi].array(mfi),
                                                              ap,
                                                              maskvals[olo].const_array(mfi),
                                                              maskvals[ohi].const_array(mfi),
                                                              bdlv[icomp][olo], bdlv[icomp][ohi],
                                                              amrex::adjCell(vbx,olo),
                                                              bdcv[icomp][olo], bdcv[icomp][ohi],
                                                              vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSEBTag const& tag) noexcept
                    {
                        if (tag.ap) {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x_eb
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x_eb
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y_eb
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y_eb
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z_eb
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z_eb
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        } else {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        }
                    });
                } else
#endif
                {
                    Vector<PSTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSTag{undrrelxr[olo].array(mfi),
                                                            undrrelxr[ohi].array(mfi),
                                                            maskvals[olo].const_array(mfi),
                                                            maskvals[ohi].const_array(mfi),
                                                            bdlv[icomp][olo], bdlv[icomp][ohi],
                                                            amrex::adjCell(vbx,olo),
                                                            bdcv[icomp][olo], bdcv[icomp][ohi],
                                                            vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSTag const& tag) noexcept
                    {
                        if (tag.dir == 0)
                        {
                            mllinop_comp_interp_coef0_x
                                (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                            mllinop_comp_interp_coef0_x
                                (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 1)
                        else
#if (AMREX_SPACEDIM > 2)
                        if (tag.dir == 1)
#endif
                        {
                            mllinop_comp_interp_coef0_y
                                (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                            mllinop_comp_interp_coef0_y
                                (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 2)
                        else {
                            mllinop_comp_interp_coef0_z
                                (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                            mllinop_comp_interp_coef0_z
                                (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                        }
#endif
#endif
                    });
                }
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(foo, MFItInfo{}.SetDynamic(true)); mfi.isValid(); ++mfi)
                {
                    const Box& vbx = mfi.validbox();

                    const auto & bdlv = bcondloc.bndryLocs(mfi);
                    const auto & bdcv = bcondloc.bndryConds(mfi);

#ifdef AMREX_USE_EB
                    auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
#endif
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (idim == hidden_direction) continue;
                        const Orientation olo(idim,Orientation::low);
                        const Orientation ohi(idim,Orientation::high);
                        const Box blo = amrex::adjCellLo(vbx, idim);
                        const Box bhi = amrex::adjCellHi(vbx, idim);
                        const int blen = vbx.length(idim);
                        const auto& mlo = maskvals[olo].array(mfi);
                        const auto& mhi = maskvals[ohi].array(mfi);
                        const auto& flo = undrrelxr[olo].array(mfi);
                        const auto& fhi = undrrelxr[ohi].array(mfi);
                        for (int icomp = 0; icomp < ncomp; ++icomp) {
                            const BoundCond bctlo = bdcv[icomp][olo];
                            const BoundCond bcthi = bdcv[icomp][ohi];
                            const Real bcllo = bdlv[icomp][olo];
                            const Real bclhi = bdlv[icomp][ohi];
#ifdef AMREX_USE_EB
                            if (fabtyp == FabType::singlevalued) {
                                Array4<Real const> const& ap = area[idim]->const_array(mfi);
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            } else if (fabtyp == FabType::regular)
#endif
                            {
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}